

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

RegOpnd * __thiscall
Lowerer::GenerateCachedTypeCheck
          (Lowerer *this,Instr *instrChk,PropertySymOpnd *propertySymOpnd,
          LabelInstr *labelObjCheckFailed,LabelInstr *labelTypeCheckFailed,
          LabelInstr *labelSecondChance)

{
  LowererMD *this_00;
  Func *func;
  ObjTypeSpecFldInfo *this_01;
  Sym *pSVar1;
  code *pcVar2;
  JITTypeHolderBase<void> type;
  bool bVar3;
  bool bVar4;
  BYTE scale;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined4 *puVar9;
  RegOpnd *pRVar10;
  IndirOpnd *src;
  JitEquivalentTypeGuard *typeCheckGuard;
  void *pvVar11;
  RegOpnd *baseOpnd;
  JitPolyEquivalentTypeGuard *pJVar12;
  AddrOpnd *pAVar13;
  JITType *this_02;
  intptr_t address;
  JITTimeFunctionBody *pJVar14;
  FunctionJITTimeInfo *pFVar15;
  char16 *pcVar16;
  LabelInstr *target;
  BranchInstr *pBVar17;
  LabelInstr *target_00;
  HelperCallOpnd *src1Opnd;
  Instr *instr;
  char16_t *pcVar18;
  Lowerer *pLVar19;
  JITTypeHolder target_01;
  JnHelperMethod fnHelper;
  nullptr_t local_4a8;
  WCHAR prefixValue [512];
  JITTypeHolderBase<void> local_88;
  JITTypeHolder directCheckType;
  RegOpnd *local_78;
  IndirOpnd *local_70;
  JITTypeHolderBase<void> local_58;
  JITTypeHolder monoType;
  
  if ((propertySymOpnd->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) ||
     ((bVar3 = IR::PropertySymOpnd::IsTypeCheckSeqCandidate(propertySymOpnd), !bVar3 &&
      (((ushort)propertySymOpnd->field_12 & 2) == 0)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1d96,"(propertySymOpnd->MayNeedTypeCheckProtection())",
                       "propertySymOpnd->MayNeedTypeCheckProtection()");
    if (!bVar3) goto LAB_005d0488;
    *puVar9 = 0;
  }
  func = instrChk->m_func;
  directCheckType.t = (Type)labelTypeCheckFailed;
  pRVar10 = IR::SymOpnd::CreatePropertyOwnerOpnd(&propertySymOpnd->super_SymOpnd,func);
  IR::Opnd::SetValueType
            (&pRVar10->super_Opnd,
             (ValueType)
             SUB42(*(undefined4 *)&(propertySymOpnd->super_SymOpnd).propertyOwnerValueType,0));
  bVar3 = IR::Opnd::IsNotTaggedValue(&pRVar10->super_Opnd);
  if (!bVar3) {
    LowererMD::GenerateObjectTest
              (&this->m_lowererMD,&pRVar10->super_Opnd,instrChk,labelObjCheckFailed,false);
  }
  monoType.t = (Type)IR::RegOpnd::New(TyInt64,func);
  bVar3 = StackSym::IsConst(pRVar10->m_sym);
  if (((!bVar3) || (bVar3 = StackSym::IsIntConst(pRVar10->m_sym), bVar3)) ||
     (bVar3 = StackSym::IsFloatConst(pRVar10->m_sym), bVar3)) {
    src = IR::IndirOpnd::New(pRVar10,8,TyInt64,func,false);
  }
  else {
    pvVar11 = StackSym::GetConstAddress(pRVar10->m_sym,false);
    src = (IndirOpnd *)
          IR::MemRefOpnd::New((void *)((long)pvVar11 + 8),TyInt64,func,
                              AddrOpndKindDynamicObjectTypeRef);
  }
  InsertMove((Opnd *)monoType.t,&src->super_Opnd,instrChk,true);
  bVar3 = IR::Instr::HasEquivalentTypeCheckBailOut(instrChk);
  if ((!bVar3) ||
     ((bVar3 = true, -1 < (char)(propertySymOpnd->field_12).field_0.field_5.typeCheckSeqFlags &&
      ((PropertySymOpnd *)instrChk->m_dst != propertySymOpnd)))) {
    if ((propertySymOpnd->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0) &&
       ((bVar3 = ObjTypeSpecFldInfo::HasEquivalentTypeSet(propertySymOpnd->objTypeSpecFldInfo),
        bVar3 && ((bVar3 = IR::PropertySymOpnd::HasFinalType(propertySymOpnd), !bVar3 ||
                  (bVar3 = IR::PropertySymOpnd::HasInitialType(propertySymOpnd), !bVar3)))))) {
      local_4a8 = (nullptr_t)0x0;
      bVar3 = JITTypeHolderBase<void>::operator!=(&propertySymOpnd->monoGuardType,&local_4a8);
      if (!bVar3) {
        if (propertySymOpnd->objTypeSpecFldInfo != (ObjTypeSpecFldInfo *)0x0) {
          bVar5 = ObjTypeSpecFldInfo::IsPoly(propertySymOpnd->objTypeSpecFldInfo);
          bVar3 = true;
          if (bVar5) goto LAB_005cfbe6;
        }
        bVar3 = IR::Instr::HasTypeCheckBailOut(instrChk);
        goto LAB_005cfbe6;
      }
    }
    bVar3 = false;
  }
LAB_005cfbe6:
  bVar5 = bVar3;
  if (bVar3 == false) {
    bVar4 = IR::Instr::HasEquivalentTypeCheckBailOut(instrChk);
    if (bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1db8,"(doEquivTypeCheck || !instrChk->HasEquivalentTypeCheckBailOut())",
                         "doEquivTypeCheck || !instrChk->HasEquivalentTypeCheckBailOut()");
      if (!bVar5) goto LAB_005d0488;
      *puVar9 = 0;
      bVar5 = false;
    }
    JITTypeHolderBase<void>::JITTypeHolderBase(&local_58,(JITType *)0x0);
    if (bVar5 != false) goto LAB_005cfc79;
    local_4a8 = (nullptr_t)0x0;
    bVar5 = JITTypeHolderBase<void>::operator!=(&propertySymOpnd->monoGuardType,&local_4a8);
    if (bVar5) {
      local_58.t = (propertySymOpnd->monoGuardType).t;
    }
    else {
      local_58.t = (Type)IR::PropertySymOpnd::GetType(propertySymOpnd);
    }
    typeCheckGuard =
         (JitEquivalentTypeGuard *)
         CreateTypePropertyGuardForGuardedProperties(this,(JITTypeHolder)local_58.t,propertySymOpnd)
    ;
    local_78 = (RegOpnd *)0x0;
    bVar5 = bVar3;
  }
  else {
    JITTypeHolderBase<void>::JITTypeHolderBase(&local_58,(JITType *)0x0);
LAB_005cfc79:
    typeCheckGuard = CreateEquivalentTypeGuardAndLinkToGuardedProperties(this,propertySymOpnd);
    if ((typeCheckGuard->super_JitIndexedPropertyGuard).super_PropertyGuard.isPoly == true) {
      bVar4 = IR::PropertySymOpnd::ShouldUsePolyEquivTypeGuard(propertySymOpnd,this->m_func);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x1dc4,"(propertySymOpnd->ShouldUsePolyEquivTypeGuard(this->m_func))",
                           "propertySymOpnd->ShouldUsePolyEquivTypeGuard(this->m_func)");
        if (!bVar4) goto LAB_005d0488;
        *puVar9 = 0;
      }
      local_78 = GeneratePolymorphicTypeIndex
                           (this,(RegOpnd *)monoType.t,(PropertyGuard *)typeCheckGuard,instrChk);
    }
    else {
      local_78 = (RegOpnd *)0x0;
    }
  }
  JITTypeHolderBase<void>::JITTypeHolderBase(&local_88,(JITType *)0x0);
  if (typeCheckGuard == (JitEquivalentTypeGuard *)0x0) {
    local_4a8 = (nullptr_t)0x0;
    bVar4 = JITTypeHolderBase<void>::operator!=(&local_58,&local_4a8);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1dd3,"(monoType != nullptr)","monoType != nullptr");
      if (!bVar4) goto LAB_005d0488;
      *puVar9 = 0;
    }
    this_02 = JITTypeHolderBase<void>::operator->(&local_58);
    address = JITType::GetAddr(this_02);
    local_70 = (IndirOpnd *)IR::AddrOpnd::New(address,AddrOpndKindDynamicType,func,true,(Var)0x0);
    local_88.t = local_58.t;
  }
  else if (local_78 == (RegOpnd *)0x0) {
    local_70 = (IndirOpnd *)
               IR::MemRefOpnd::New(typeCheckGuard,TyUint64,func,AddrOpndKindDynamicGuardValueRef);
  }
  else {
    baseOpnd = IR::RegOpnd::New(TyUint64,func);
    pJVar12 = Js::PropertyGuard::AsPolyTypeCheckGuard((PropertyGuard *)typeCheckGuard);
    pAVar13 = IR::AddrOpnd::New(pJVar12->polyValues,AddrOpndKindDynamicTypeCheckGuard,func,true,
                                (Var)0x0);
    InsertMove(&baseOpnd->super_Opnd,&pAVar13->super_Opnd,instrChk,true);
    scale = LowererMDArch::GetDefaultIndirScale();
    local_70 = IR::IndirOpnd::New(baseOpnd,local_78,scale,TyUint64,func);
    bVar5 = bVar3;
  }
  pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
  pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
  uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
  pLVar19 = (Lowerer *)&DAT_015cd718;
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,ObjTypeSpecPhase,uVar6,uVar7);
  if ((bVar4) && (DAT_015d346a == '\x01')) {
    pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
    pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
    uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,ObjTypeSpecPhase,uVar6,uVar7);
    if (bVar4) {
      pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      pcVar16 = JITTimeFunctionBody::GetDisplayName(pJVar14);
      pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      uVar6 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
      pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->m_func->m_workItem);
      uVar7 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
      pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      uVar8 = JITTimeFunctionBody::GetFunctionNumber(pJVar14);
      swprintf_s<512ul>((WCHAR (*) [512])&local_4a8,L"%s (#%d.%u, #%u)",pcVar16,(ulong)uVar6,
                        (ulong)uVar7,(ulong)uVar8);
      prefixValue[0x1fc] = L'\0';
      prefixValue[0x1fd] = L'\0';
      prefixValue[0x1fe] = L'\0';
      prefixValue[0x1ff] = L'\0';
      bVar4 = JITTypeHolderBase<void>::operator!=(&local_88,(nullptr_t *)(prefixValue + 0x1fc));
      if (bVar4) {
        pcVar18 = L"direct";
      }
      else if (propertySymOpnd->objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
        pcVar18 = L"indirect";
      }
      else {
        bVar4 = ObjTypeSpecFldInfo::IsPoly(propertySymOpnd->objTypeSpecFldInfo);
        pcVar18 = L"indirect";
        if (bVar4) {
          pcVar18 = L"equivalent";
        }
      }
      Output::TraceWithPrefix
                (ObjTypeSpecPhase,(char16 *)&local_4a8,L"Emitted %s type check ",pcVar18);
    }
    if (propertySymOpnd->guardedPropOps == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pLVar19 = (Lowerer *)0xfcdf42;
      Output::Print(L"\n");
    }
    else {
      Output::Print(L" guarding operations:\n    ");
      pLVar19 = (Lowerer *)propertySymOpnd->guardedPropOps;
      BVSparse<Memory::JitArenaAllocator>::Dump((BVSparse<Memory::JitArenaAllocator> *)pLVar19);
    }
    Output::Flush();
  }
  if (bVar5 == false) {
    target_01.t = directCheckType.t;
    if (labelSecondChance != (LabelInstr *)0x0) {
      target_01.t = (Type)labelSecondChance;
    }
    pBVar17 = InsertCompareBranch(pLVar19,(Opnd *)monoType.t,&local_70->super_Opnd,BrNeq_A,false,
                                  (LabelInstr *)target_01.t,instrChk,false);
    LowererMD::InsertObjectPoison(&pRVar10->super_Opnd,pBVar17,instrChk,false);
    bVar3 = false;
  }
  else {
    pLVar19 = (Lowerer *)0x176;
    target = IR::LabelInstr::New(Label,func,true);
    pBVar17 = InsertCompareBranch(pLVar19,(Opnd *)monoType.t,&local_70->super_Opnd,BrNeq_A,false,
                                  target,instrChk,false);
    LowererMD::InsertObjectPoison(&pRVar10->super_Opnd,pBVar17,instrChk,false);
    target_00 = IR::LabelInstr::New(Label,func,false);
    InsertBranch(Br,false,target_00,instrChk);
    IR::Instr::InsertBefore(instrChk,&target->super_Instr);
    pAVar13 = IR::AddrOpnd::New(typeCheckGuard,AddrOpndKindDynamicTypeCheckGuard,func,true,(Var)0x0)
    ;
    this_01 = propertySymOpnd->objTypeSpecFldInfo;
    if (local_78 == (RegOpnd *)0x0) {
      if (this_01 == (ObjTypeSpecFldInfo *)0x0) {
        fnHelper = HelperCheckIfTypeIsEquivalent;
      }
      else {
        bVar5 = ObjTypeSpecFldInfo::HasFixedValue(this_01);
        fnHelper = bVar5 + HelperCheckIfTypeIsEquivalent;
      }
    }
    else {
      if (this_01 == (ObjTypeSpecFldInfo *)0x0) {
        fnHelper = HelperCheckIfPolyTypeIsEquivalent;
      }
      else {
        bVar5 = ObjTypeSpecFldInfo::HasFixedValue(this_01);
        fnHelper = bVar5 + HelperCheckIfPolyTypeIsEquivalent;
      }
      LowererMD::LoadHelperArgument(&this->m_lowererMD,instrChk,&local_78->super_Opnd);
    }
    this_00 = &this->m_lowererMD;
    LowererMD::LoadHelperArgument(this_00,instrChk,&pAVar13->super_Opnd);
    LowererMD::LoadHelperArgument(this_00,instrChk,(Opnd *)monoType.t);
    pRVar10 = IR::RegOpnd::New(TyUint8,func);
    src1Opnd = IR::HelperCallOpnd::New(fnHelper,func);
    instr = IR::Instr::New(Call,&pRVar10->super_Opnd,&src1Opnd->super_Opnd,func);
    IR::Instr::InsertBefore(instrChk,instr);
    LowererMD::LowerCall(this_00,instr,0);
    InsertTest(&pRVar10->super_Opnd,&pRVar10->super_Opnd,instrChk);
    InsertBranch(BrEq_A,false,(LabelInstr *)directCheckType.t,instrChk);
    IR::Instr::InsertBefore(instrChk,&target_00->super_Instr);
  }
  if (bVar3 == false) {
    local_4a8 = (nullptr_t)0x0;
    bVar3 = JITTypeHolderBase<void>::operator!=(&local_58,&local_4a8);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1e51,"(monoType != nullptr)","monoType != nullptr");
      if (!bVar3) goto LAB_005d0488;
      *puVar9 = 0;
    }
    type.t = (Type)local_58;
    pSVar1 = (propertySymOpnd->super_SymOpnd).m_sym;
    if (pSVar1->m_kind != SymKindProperty) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
      if (!bVar3) {
LAB_005d0488:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar9 = 0;
    }
    PinTypeRef(this,(JITTypeHolder)type.t,type.t,instrChk,*(PropertyId *)&pSVar1[1]._vptr_Sym);
  }
  return (RegOpnd *)monoType.t;
}

Assistant:

IR::RegOpnd *
Lowerer::GenerateCachedTypeCheck(IR::Instr *instrChk, IR::PropertySymOpnd *propertySymOpnd, IR::LabelInstr* labelObjCheckFailed, IR::LabelInstr *labelTypeCheckFailed, IR::LabelInstr *labelSecondChance)
{
    Assert(propertySymOpnd->MayNeedTypeCheckProtection());

    Func* func = instrChk->m_func;
    IR::RegOpnd *regOpnd = propertySymOpnd->CreatePropertyOwnerOpnd(func);
    regOpnd->SetValueType(propertySymOpnd->GetPropertyOwnerValueType());

    if (!regOpnd->IsNotTaggedValue())
    {
        m_lowererMD.GenerateObjectTest(regOpnd, instrChk, labelObjCheckFailed);
    }

    // Load the current object type into typeOpnd
    IR::RegOpnd* typeOpnd = IR::RegOpnd::New(TyMachReg, func);
    IR::Opnd *sourceType;
    if (regOpnd->m_sym->IsConst() && !regOpnd->m_sym->IsIntConst() && !regOpnd->m_sym->IsFloatConst())
    {
        sourceType = IR::MemRefOpnd::New((BYTE*)regOpnd->m_sym->GetConstAddress() +
            Js::RecyclableObject::GetOffsetOfType(), TyMachReg, func, IR::AddrOpndKindDynamicObjectTypeRef);
    }
    else
    {
        sourceType = IR::IndirOpnd::New(regOpnd, Js::RecyclableObject::GetOffsetOfType(), TyMachReg, func);
    }
    InsertMove(typeOpnd, sourceType, instrChk);

    // Note: don't attempt equivalent type check if we're doing a final type optimization or if we have a monomorphic
    // cache and no type check bailout. In the latter case, we can wind up doing expensive failed equivalence checks
    // repeatedly and never rejit.
    bool doEquivTypeCheck =
        (instrChk->HasEquivalentTypeCheckBailOut() && (propertySymOpnd->TypeCheckRequired() || propertySymOpnd == instrChk->GetDst())) ||
        (propertySymOpnd->HasEquivalentTypeSet() &&
         !(propertySymOpnd->HasFinalType() && propertySymOpnd->HasInitialType()) &&
         !propertySymOpnd->MustDoMonoCheck() &&
         (propertySymOpnd->IsPoly() || instrChk->HasTypeCheckBailOut()));
    Assert(doEquivTypeCheck || !instrChk->HasEquivalentTypeCheckBailOut());

    // Create and initialize the property guard if required. Note that for non-shared monomorphic checks we can refer
    // directly to the (pinned) type and not use a guard.
    Js::PropertyGuard * typeCheckGuard;
    IR::RegOpnd * polyIndexOpnd = nullptr;
    JITTypeHolder monoType = nullptr;
    if (doEquivTypeCheck)
    {
        typeCheckGuard = CreateEquivalentTypeGuardAndLinkToGuardedProperties(propertySymOpnd);
        if (typeCheckGuard->IsPoly())
        {
            Assert(propertySymOpnd->ShouldUsePolyEquivTypeGuard(this->m_func));
            polyIndexOpnd = this->GeneratePolymorphicTypeIndex(typeOpnd, typeCheckGuard, instrChk);
        }
    }
    else
    {
        monoType = propertySymOpnd->MustDoMonoCheck() ? propertySymOpnd->GetMonoGuardType() : propertySymOpnd->GetType();
        typeCheckGuard = this->CreateTypePropertyGuardForGuardedProperties(monoType, propertySymOpnd);
    }

    // Create the opnd we will check against the current type.
    IR::Opnd *expectedTypeOpnd;
    JITTypeHolder directCheckType = nullptr;
    if (typeCheckGuard == nullptr)
    {
        Assert(monoType != nullptr);
        expectedTypeOpnd = IR::AddrOpnd::New(monoType->GetAddr(), IR::AddrOpndKindDynamicType, func, true);
        directCheckType = monoType;
    }
    else
    {
        Assert(Js::PropertyGuard::GetSizeOfValue() == static_cast<size_t>(TySize[TyMachPtr]));

        if (this->m_func->IsOOPJIT())
        {
            if (polyIndexOpnd != nullptr)
            {
                IR::RegOpnd * baseOpnd = IR::RegOpnd::New(TyMachPtr, func);
                this->GenerateLeaOfOOPData(baseOpnd, typeCheckGuard, Js::JitPolyEquivalentTypeGuard::GetOffsetOfPolyValues(), instrChk);
                expectedTypeOpnd = IR::IndirOpnd::New(baseOpnd, polyIndexOpnd, m_lowererMD.GetDefaultIndirScale(), TyMachPtr, func);
            }
            else
            {
                expectedTypeOpnd = this->GenerateIndirOfOOPData(typeCheckGuard, 0, instrChk);
            }
            this->addToLiveOnBackEdgeSyms->Set(func->GetTopFunc()->GetNativeCodeDataSym()->m_id);
        }
        else
        {
            if (polyIndexOpnd != nullptr)
            {
                IR::RegOpnd * baseOpnd = IR::RegOpnd::New(TyMachPtr, func);
                InsertMove(baseOpnd, IR::AddrOpnd::New((Js::Var)typeCheckGuard->AsPolyTypeCheckGuard()->GetAddressOfPolyValues(), IR::AddrOpndKindDynamicTypeCheckGuard, func, true), instrChk);
                expectedTypeOpnd = IR::IndirOpnd::New(baseOpnd, polyIndexOpnd, m_lowererMD.GetDefaultIndirScale(), TyMachPtr, func);
            }
            else
            {
                expectedTypeOpnd = IR::MemRefOpnd::New((void*)(typeCheckGuard->GetAddressOfValue()), TyMachPtr, func, IR::AddrOpndKindDynamicGuardValueRef);
            }
        }
    }

    if (PHASE_VERBOSE_TRACE(Js::ObjTypeSpecPhase, this->m_func))
    {
        OUTPUT_VERBOSE_TRACE_FUNC(Js::ObjTypeSpecPhase, this->m_func, _u("Emitted %s type check "),
            directCheckType != nullptr ? _u("direct") : propertySymOpnd->IsPoly() ? _u("equivalent") : _u("indirect"));
#if DBG
        if (propertySymOpnd->GetGuardedPropOps() != nullptr)
        {
            Output::Print(_u(" guarding operations:\n    "));
            propertySymOpnd->GetGuardedPropOps()->Dump();
        }
        else
        {
            Output::Print(_u("\n"));
        }
#else
        Output::Print(_u("\n"));
#endif
        Output::Flush();
    }

    if (doEquivTypeCheck)
    {
        // TODO (ObjTypeSpec): For isolated equivalent type checks it would be good to emit a check if the cache is still valid, and
        // if not go straight to live polymorphic cache.  This way we wouldn't have to bail out and re-JIT, and also wouldn't continue
        // to try the equivalent type cache, miss it and do the slow comparison. This may be as easy as sticking a null on the main
        // type in the equivalent type cache.
        IR::LabelInstr* labelCheckEquivalentType = IR::LabelInstr::New(Js::OpCode::Label, func, true);
        IR::BranchInstr* branchInstr = InsertCompareBranch(typeOpnd, expectedTypeOpnd, Js::OpCode::BrNeq_A, labelCheckEquivalentType, instrChk);

        InsertObjectPoison(regOpnd, branchInstr, instrChk, false);

        IR::LabelInstr *labelTypeCheckSucceeded = IR::LabelInstr::New(Js::OpCode::Label, func, false);
        InsertBranch(Js::OpCode::Br, labelTypeCheckSucceeded, instrChk);

        instrChk->InsertBefore(labelCheckEquivalentType);

        IR::Opnd* typeCheckGuardOpnd = nullptr;
        if (this->m_func->IsOOPJIT())
        {
            typeCheckGuardOpnd = IR::RegOpnd::New(TyMachPtr, func);
            this->GenerateLeaOfOOPData(typeCheckGuardOpnd->AsRegOpnd(), typeCheckGuard, 0, instrChk);
            this->addToLiveOnBackEdgeSyms->Set(func->GetTopFunc()->GetNativeCodeDataSym()->m_id);
        }
        else
        {
            typeCheckGuardOpnd = IR::AddrOpnd::New((Js::Var)typeCheckGuard, IR::AddrOpndKindDynamicTypeCheckGuard, func, true);
        }

        IR::JnHelperMethod helperMethod;
        if (polyIndexOpnd != nullptr)
        {
            helperMethod = propertySymOpnd->HasFixedValue() ? IR::HelperCheckIfPolyTypeIsEquivalentForFixedField : IR::HelperCheckIfPolyTypeIsEquivalent;

            this->m_lowererMD.LoadHelperArgument(instrChk, polyIndexOpnd);
        }
        else
        {
            helperMethod = propertySymOpnd->HasFixedValue() ? IR::HelperCheckIfTypeIsEquivalentForFixedField : IR::HelperCheckIfTypeIsEquivalent;
        }
        this->m_lowererMD.LoadHelperArgument(instrChk, typeCheckGuardOpnd);
        this->m_lowererMD.LoadHelperArgument(instrChk, typeOpnd);

        IR::RegOpnd* equivalentTypeCheckResultOpnd = IR::RegOpnd::New(TyUint8, func);
        IR::HelperCallOpnd* equivalentTypeCheckHelperCallOpnd = IR::HelperCallOpnd::New(helperMethod, func);
        IR::Instr* equivalentTypeCheckCallInstr = IR::Instr::New(Js::OpCode::Call, equivalentTypeCheckResultOpnd, equivalentTypeCheckHelperCallOpnd, func);
        instrChk->InsertBefore(equivalentTypeCheckCallInstr);
        this->m_lowererMD.LowerCall(equivalentTypeCheckCallInstr, 0);

        InsertTestBranch(equivalentTypeCheckResultOpnd, equivalentTypeCheckResultOpnd, Js::OpCode::BrEq_A, labelTypeCheckFailed, instrChk);

        // TODO (ObjTypeSpec): Consider emitting a shared bailout to which a specific bailout kind is written at runtime. This would allow us to distinguish
        // between non-equivalent type and other cases, such as invalidated guard (due to fixed field overwrite, perhaps) or too much thrashing on the
        // equivalent type cache. We could determine bailout kind based on the value returned by the helper. In the case of cache thrashing we could just
        // turn off the whole optimization for a given function.

        instrChk->InsertBefore(labelTypeCheckSucceeded);
    }
    else
    {
        IR::BranchInstr* branchInstr = InsertCompareBranch(typeOpnd, expectedTypeOpnd, Js::OpCode::BrNeq_A, labelSecondChance != nullptr ? labelSecondChance : labelTypeCheckFailed, instrChk);
        InsertObjectPoison(regOpnd, branchInstr, instrChk, false);
    }

    // Don't pin the type for polymorphic operations. The code can successfully execute even if this type is no longer referenced by any objects,
    // as long as there are other objects with types equivalent on the properties referenced by this code. The type is kept alive until entry point
    // installation by the JIT transfer data, and after that by the equivalent type cache, so it will stay alive unless or until it gets evicted
    // from the cache.
    if (!doEquivTypeCheck)
    {
        Assert(monoType != nullptr);
        PinTypeRef(monoType, monoType.t, instrChk, propertySymOpnd->m_sym->AsPropertySym()->m_propertyId);
    }

    return typeOpnd;
}